

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPrivKeys
          (LegacyScriptPubKeyMan *this,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,int64_t timestamp)

{
  _Base_ptr *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  int64_t iVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  long args_1;
  _Rb_tree_header *p_Var8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  CPubKey pubkey;
  WalletBatch local_b0;
  string local_a0;
  CPubKey local_79;
  long local_38;
  WalletDatabase *pWVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_b0,pWVar3,1);
  p_Var6 = (privkey_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(privkey_map->_M_t)._M_impl.super__Rb_tree_header;
  bVar1 = true;
  local_b0.m_database = pWVar3;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      this_00 = &p_Var6[1]._M_right;
      CKey::GetPubKey(&local_79,(CKey *)this_00);
      bVar1 = CKey::VerifyPubKey((CKey *)this_00,&local_79);
      if (!bVar1) {
        __assert_fail("key.VerifyPubKey(pubkey)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                      ,0x65d,
                      "bool wallet::LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey> &, const int64_t)"
                     );
      }
      iVar2 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1d])
                        (this,p_Var6 + 1);
      if ((char)iVar2 == '\0') {
        pmVar4 = std::
                 map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                 ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)(p_Var6 + 1))
        ;
        pmVar4->nCreateTime = timestamp;
        bVar1 = AddKeyPubKeyWithDB(this,&local_b0,(CKey *)this_00,&local_79);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00219595;
        }
        iVar5 = 1;
        if ((timestamp < 2) ||
           (args_1 = this->nTimeFirstKey, iVar5 = timestamp,
           args_1 == 0x7fffffffffffffff || timestamp < args_1)) {
          this->nTimeFirstKey = iVar5;
          args_1 = iVar5;
        }
        boost::signals2::
        signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
        ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyFirstKeyTimeChanged,
                     (ScriptPubKeyMan *)this,args_1);
      }
      else {
        sVar7 = 0x21;
        if ((local_79.vch[0] & 0xfe) != 2) {
          if ((byte)(local_79.vch[0] - 4) < 4) {
            sVar7 = *(size_t *)(&DAT_0049a7a8 + (ulong)(byte)(local_79.vch[0] - 4) * 8);
          }
          else {
            sVar7 = 0;
          }
        }
        s.m_size = sVar7;
        s.m_data = local_79.vch;
        HexStr_abi_cxx11_(&local_a0,s);
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                  ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x4a326d,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
    bVar1 = true;
  }
LAB_00219595:
  if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
      local_b0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_b0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey>& privkey_map, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : privkey_map) {
        const CKey& key = entry.second;
        CPubKey pubkey = key.GetPubKey();
        const CKeyID& id = entry.first;
        assert(key.VerifyPubKey(pubkey));
        // Skip if we already have the key
        if (HaveKey(id)) {
            WalletLogPrintf("Already have key with pubkey %s, skipping\n", HexStr(pubkey));
            continue;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;
        // If the private key is not present in the wallet, insert it.
        if (!AddKeyPubKeyWithDB(batch, key, pubkey)) {
            return false;
        }
        UpdateTimeFirstKey(timestamp);
    }
    return true;
}